

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O0

string * __thiscall
glcts::(anonymous_namespace)::UniformSimple::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  UniformSimple *this_local;
  
  local_18 = this;
  this_local = (UniformSimple *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 310 es                \nuniform mediump vec4 recolor;  \nout mediump vec4 color;        \nvoid main() {                  \n    color = vec4(0, 1, 0, 1) + recolor;  \n}"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 310 es                \n"
			   "uniform mediump vec4 recolor;  \n"
			   "out mediump vec4 color;        \n"
			   "void main() {                  \n"
			   "    color = vec4(0, 1, 0, 1) + recolor;  \n"
			   "}";
	}